

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcProve.c
# Opt level: O2

void Abc_NtkMiterPrint(Abc_Ntk_t *pNtk,char *pString,abctime clk,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  int level;
  
  if (fVerbose != 0) {
    uVar1 = pNtk->nObjCounts[7];
    if (pNtk->ntkType == ABC_NTK_STRASH) {
      uVar2 = Abc_AigLevel(pNtk);
    }
    else {
      uVar2 = Abc_NtkLevel(pNtk);
    }
    level = 0x6b2ee5;
    printf("Nodes = %7d.  Levels = %4d.  ",(ulong)uVar1,(ulong)uVar2);
    Abc_Print(level,"%s =",pString);
    aVar3 = Abc_Clock();
    Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - clk) / 1000000.0);
    return;
  }
  return;
}

Assistant:

void Abc_NtkMiterPrint( Abc_Ntk_t * pNtk, char * pString, abctime clk, int fVerbose )
{
    if ( !fVerbose )
        return;
    printf( "Nodes = %7d.  Levels = %4d.  ", Abc_NtkNodeNum(pNtk), 
        Abc_NtkIsStrash(pNtk)? Abc_AigLevel(pNtk) : Abc_NtkLevel(pNtk) );
    ABC_PRT( pString, Abc_Clock() - clk );
}